

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool globalMatchesCrit(GlobalVariable *G,uint line,string *obj)

{
  bool bVar1;
  uint uVar2;
  iterator ppDVar3;
  iterator ppDVar4;
  DIGlobalVariable *this;
  SmallVector<llvm::DIGlobalVariableExpression_*,_2U> *in_RDX;
  uint in_ESI;
  SmallVectorImpl *in_RDI;
  DIGlobalVariable *var;
  DIGlobalVariableExpression *GV;
  iterator __end2;
  iterator __begin2;
  SmallVector<llvm::DIGlobalVariableExpression_*,_2U> *__range2;
  bool has_match;
  SmallVector<llvm::DIGlobalVariableExpression_*,_2U> GVs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  StringRef *in_stack_ffffffffffffff78;
  SmallVectorTemplateCommon<llvm::DIGlobalVariableExpression_*,_void> local_70 [2];
  undefined1 local_50 [16];
  string local_40 [44];
  uint local_14;
  SmallVectorImpl *local_10;
  byte local_1;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_50 = llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff78);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDX,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_40);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    if (local_14 != 0) {
      llvm::SmallVector<llvm::DIGlobalVariableExpression_*,_2U>::SmallVector
                ((SmallVector<llvm::DIGlobalVariableExpression_*,_2U> *)0x1e08ad);
      llvm::GlobalVariable::getDebugInfo(local_10);
      bVar1 = false;
      ppDVar3 = llvm::SmallVectorTemplateCommon<llvm::DIGlobalVariableExpression_*,_void>::begin
                          (local_70);
      ppDVar4 = llvm::SmallVectorTemplateCommon<llvm::DIGlobalVariableExpression_*,_void>::end
                          ((SmallVectorTemplateCommon<llvm::DIGlobalVariableExpression_*,_void> *)
                           in_RDX);
      for (; ppDVar3 != ppDVar4; ppDVar3 = ppDVar3 + 1) {
        this = llvm::DIGlobalVariableExpression::getVariable((DIGlobalVariableExpression *)0x1e090f)
        ;
        uVar2 = llvm::DIVariable::getLine((DIVariable *)this);
        if (uVar2 == local_14) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        local_1 = 0;
      }
      llvm::SmallVector<llvm::DIGlobalVariableExpression_*,_2U>::~SmallVector(in_RDX);
      if (!bVar1) goto LAB_001e0981;
    }
    local_1 = 1;
  }
LAB_001e0981:
  return (bool)(local_1 & 1);
}

Assistant:

static bool globalMatchesCrit(const llvm::GlobalVariable &G, unsigned line,
                              const std::string &obj) {
    if (obj != G.getName().str()) {
        return false;
    }

#if LLVM_VERSION_MAJOR < 4
    return true;
#else
    if (line > 0) {
        llvm::SmallVector<llvm::DIGlobalVariableExpression *, 2> GVs;
        G.getDebugInfo(GVs);
        bool has_match = false;
        for (auto *GV : GVs) {
            auto *var = GV->getVariable();
            if (var->getLine() == line) {
                has_match = true;
                break;
            }
        }
        if (!has_match)
            return false;
    }
#endif // LLVM >= 4

    return true;
}